

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O2

void __thiscall
OrderMoney::OrderMoney<>
          (OrderMoney *this,shared_ptr<const_Money> *a,shared_ptr<const_Money> *b,
          shared_ptr<const_Money> *c)

{
  shared_ptr<const_Money> local_48;
  shared_ptr<const_Money> local_38;
  
  std::make_shared<OrderMoney,std::shared_ptr<Money_const>const&,std::shared_ptr<Money_const>const&>
            (&local_48,a);
  local_38.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OrderMoney(this,&local_38,c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

OrderMoney(
		const std::shared_ptr<const Money> &a,
		const std::shared_ptr<const Money> &b,
		const std::shared_ptr<const Money> &c,
		const T & ...d
	) : OrderMoney(std::make_shared<OrderMoney>(a, b), c, d...)
	{
	}